

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void * Realloc(void *ptr,size_t size)

{
  void *ptr_00;
  ulong in_RSI;
  void *in_RDI;
  void *new;
  MemInfo *point;
  undefined8 local_8;
  
  ptr_00 = (void *)((long)in_RDI + -0x18);
  local_8 = in_RDI;
  if (*(ulong *)((long)in_RDI + -8) < in_RSI) {
    local_8 = Malloc(in_RSI);
    if (local_8 == (void *)0x0) {
      local_8 = (void *)0x0;
    }
    else {
      memcpy(local_8,in_RDI,*(size_t *)((long)ptr_00 + 0x10));
      Free(ptr_00);
    }
  }
  return local_8;
}

Assistant:

void *Realloc(void *ptr, size_t size)
{
  struct MemInfo *point;
  void *new;
  /* `point' points to the MemInfo structure: */
  point=(struct MemInfo *)((char *)ptr-sizeof(struct MemInfo));
 
  if(size<=point->size)
    /*
     * To increase performance, don't care about reallocing
     * to smaller sizes!
     */
    return(ptr);
  new=Malloc(size); /* allocate new storage */
  if(!new)
    return(NULL); /* fail! */
  
  memcpy(new, ptr, point->size); /* copy contents */

  Free(ptr); /* free old area */

  return(new); /* return new pointer */
}